

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextengine.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1754b00::Itemizer::generate
          (Itemizer *this,int start,int length,Capitalization caps)

{
  QScriptAnalysis *pQVar1;
  QScriptAnalysis QVar2;
  QList<QScriptItem> *pQVar3;
  qsizetype qVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  iterator iVar8;
  QTextBoundaryFinder *pQVar9;
  ulong uVar10;
  ulong uVar11;
  QScriptAnalysis *pQVar12;
  int iVar13;
  char cVar14;
  QScriptAnalysis QVar15;
  char16_t *pcVar16;
  pointer __p;
  long lVar17;
  ulong uVar18;
  long in_FS_OFFSET;
  bool bVar19;
  QStringView QVar20;
  char16_t *local_68;
  QScriptItem local_58;
  long local_38;
  
  uVar11 = (ulong)(uint)start;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (caps == MixedCase) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      generateScriptItems(this,start,length);
      return;
    }
  }
  else {
    if (caps == Capitalize) {
      if (length != 0) {
        pQVar9 = (this->m_splitter)._M_t.
                 super___uniq_ptr_impl<QTextBoundaryFinder,_std::default_delete<QTextBoundaryFinder>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QTextBoundaryFinder_*,_std::default_delete<QTextBoundaryFinder>_>
                 .super__Head_base<0UL,_QTextBoundaryFinder_*,_false>._M_head_impl;
        if (pQVar9 == (QTextBoundaryFinder *)0x0) {
          pcVar16 = (this->m_string->d).ptr;
          qVar4 = (this->m_string->d).size;
          if (pcVar16 == (char16_t *)0x0) {
            pcVar16 = (char16_t *)&QString::_empty;
          }
          pQVar9 = (QTextBoundaryFinder *)operator_new(0x48);
          QVar20.m_data = pcVar16;
          QVar20.m_size = qVar4;
          QTextBoundaryFinder::QTextBoundaryFinder(pQVar9,Word,QVar20,(uchar *)0x0,0);
          local_58.position = 0;
          local_58.analysis = (QScriptAnalysis)0x0;
          std::__uniq_ptr_impl<QTextBoundaryFinder,_std::default_delete<QTextBoundaryFinder>_>::
          reset((__uniq_ptr_impl<QTextBoundaryFinder,_std::default_delete<QTextBoundaryFinder>_> *)
                &this->m_splitter,pQVar9);
          std::unique_ptr<QTextBoundaryFinder,_std::default_delete<QTextBoundaryFinder>_>::
          ~unique_ptr((unique_ptr<QTextBoundaryFinder,_std::default_delete<QTextBoundaryFinder>_> *)
                      &local_58);
          pQVar9 = (this->m_splitter)._M_t.
                   super___uniq_ptr_impl<QTextBoundaryFinder,_std::default_delete<QTextBoundaryFinder>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_QTextBoundaryFinder_*,_std::default_delete<QTextBoundaryFinder>_>
                   .super__Head_base<0UL,_QTextBoundaryFinder_*,_false>._M_head_impl;
        }
        QTextBoundaryFinder::setPosition((longlong)pQVar9);
        QVar2 = this->m_analysis[start];
        uVar18 = QTextBoundaryFinder::boundaryReasons();
        QVar15 = (QScriptAnalysis)((uint)QVar2 & 0xfffff0ff | 0x200);
        if ((uVar18 & 0x20) == 0) {
          QVar15 = QVar2;
        }
        QTextBoundaryFinder::toNextBoundary();
        if (1 < length) {
          iVar5 = length + start;
          uVar18 = (ulong)(start + 1);
          do {
            uVar10 = QTextBoundaryFinder::position();
            if (uVar18 == uVar10) {
              uVar7 = QTextBoundaryFinder::boundaryReasons();
              cVar14 = (char)((uVar7 & 0x20) >> 5);
              QTextBoundaryFinder::toNextBoundary();
            }
            else {
              cVar14 = '\0';
            }
            if ((((((uint)this->m_analysis[uVar18] ^ (uint)QVar15) & 0xff0fff) != 0) ||
                (0x6ff < ((uint)this->m_analysis[uVar18] & 0xf00) || cVar14 != '\0')) ||
               (0xfff < (int)uVar18 - (int)uVar11)) {
              pQVar3 = this->m_items;
              local_58.analysis = QVar15;
              local_58.position = (int)uVar11;
              local_58.num_glyphs = 0;
              local_58.descent.val = -0x40;
              local_58.ascent.val = -0x40;
              local_58.leading.val = -0x40;
              local_58.width.val = -0x40;
              local_58.glyph_data_offset = 0;
              QtPrivate::QPodArrayOps<QScriptItem>::emplace<QScriptItem>
                        ((QPodArrayOps<QScriptItem> *)pQVar3,(pQVar3->d).size,&local_58);
              QList<QScriptItem>::end(pQVar3);
              QVar15 = this->m_analysis[uVar18];
              if (cVar14 != '\0') {
                QVar15 = (QScriptAnalysis)((uint)QVar15 & 0xfffff0ff | 0x200);
              }
              uVar11 = uVar18 & 0xffffffff;
            }
            start = (int)uVar11;
            uVar18 = uVar18 + 1;
          } while ((long)uVar18 < (long)iVar5);
        }
        pQVar3 = this->m_items;
        local_58.analysis = QVar15;
        local_58.position = start;
        local_58.num_glyphs = 0;
        local_58.descent.val = -0x40;
        local_58.ascent.val = -0x40;
        local_58.leading.val = -0x40;
        local_58.width.val = -0x40;
        local_58.glyph_data_offset = 0;
        QtPrivate::QPodArrayOps<QScriptItem>::emplace<QScriptItem>
                  ((QPodArrayOps<QScriptItem> *)pQVar3,(pQVar3->d).size,&local_58);
        QList<QScriptItem>::end(pQVar3);
      }
    }
    else if (caps == SmallCaps) {
      local_68 = (this->m_string->d).ptr;
      if (local_68 == (char16_t *)0x0) {
        local_68 = (char16_t *)&QString::_empty;
      }
      if (length != 0) {
        lVar17 = (long)start;
        iVar5 = QChar::category((uint)(ushort)local_68[lVar17]);
        bVar19 = iVar5 == 0xf;
        if (1 < length) {
          bVar19 = iVar5 == 0xf;
          iVar5 = length + start;
          uVar18 = (ulong)(start + 1);
          do {
            iVar6 = QChar::category((uint)(ushort)local_68[uVar18]);
            iVar13 = (int)uVar11;
            QVar2 = this->m_analysis[uVar18];
            QVar15 = this->m_analysis[iVar13];
            if ((((((uint)QVar15 ^ (uint)QVar2) & 0xff0fff) != 0) || (0x6ff < ((uint)QVar2 & 0xf00))
                ) || (((iVar6 == 0xf) != bVar19 || (0xfff < (int)uVar18 - iVar13)))) {
              pQVar3 = this->m_items;
              local_58.analysis = QVar15;
              local_58.position = iVar13;
              local_58.num_glyphs = 0;
              local_58.descent.val = -0x40;
              local_58.ascent.val = -0x40;
              local_58.leading.val = -0x40;
              local_58.width.val = -0x40;
              local_58.glyph_data_offset = 0;
              QtPrivate::QPodArrayOps<QScriptItem>::emplace<QScriptItem>
                        ((QPodArrayOps<QScriptItem> *)pQVar3,(pQVar3->d).size,&local_58);
              QList<QScriptItem>::end(pQVar3);
              if (bVar19 != false) {
                iVar8 = QList<QScriptItem>::end(this->m_items);
                iVar8.i[-1].analysis =
                     (QScriptAnalysis)((uint)iVar8.i[-1].analysis & 0xfffff0ff | 0x300);
              }
              uVar11 = uVar18 & 0xffffffff;
              bVar19 = iVar6 == 0xf;
            }
            start = (int)uVar11;
            uVar18 = uVar18 + 1;
          } while ((long)uVar18 < (long)iVar5);
          lVar17 = (long)start;
        }
        pQVar3 = this->m_items;
        local_58.analysis = this->m_analysis[lVar17];
        local_58.position = start;
        local_58.num_glyphs = 0;
        local_58.descent.val = -0x40;
        local_58.ascent.val = -0x40;
        local_58.leading.val = -0x40;
        local_58.width.val = -0x40;
        local_58.glyph_data_offset = 0;
        QtPrivate::QPodArrayOps<QScriptItem>::emplace<QScriptItem>
                  ((QPodArrayOps<QScriptItem> *)pQVar3,(pQVar3->d).size,&local_58);
        QList<QScriptItem>::end(pQVar3);
        if (bVar19 != false) {
          iVar8 = QList<QScriptItem>::end(this->m_items);
          iVar8.i[-1].analysis = (QScriptAnalysis)((uint)iVar8.i[-1].analysis & 0xfffff0ff | 0x300);
        }
      }
    }
    else {
      generateScriptItems(this,start,length);
      if ((this->m_items->d).size != 0) {
        iVar8 = QList<QScriptItem>::end(this->m_items);
        pQVar12 = &iVar8.i[-1].analysis;
        do {
          if (((uint)*pQVar12 & 0xc00) == 0) {
            *pQVar12 = (QScriptAnalysis)
                       ((uint)*pQVar12 & 0xfffff0ff | (uint)(caps != AllLowercase) * 0x100 + 0x100);
          }
          pQVar1 = pQVar12 + -1;
          pQVar12 = pQVar12 + -8;
        } while (start < (int)*pQVar1);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void generate(int start, int length, QFont::Capitalization caps)
    {
        if (caps == QFont::SmallCaps)
            generateScriptItemsSmallCaps(reinterpret_cast<const ushort *>(m_string.unicode()), start, length);
        else if (caps == QFont::Capitalize)
            generateScriptItemsCapitalize(start, length);
        else if (caps != QFont::MixedCase) {
            generateScriptItemsAndChangeCase(start, length,
                caps == QFont::AllLowercase ? QScriptAnalysis::Lowercase : QScriptAnalysis::Uppercase);
        }
        else
            generateScriptItems(start, length);
    }